

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptor::GetLocationPath
          (EnumValueDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *this_00;
  EnumDescriptor *this_01;
  char *pcVar1;
  int __c;
  value_type_conflict *__x;
  value_type_conflict local_20 [2];
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  EnumValueDescriptor *this_local;
  
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  this_01 = type(this);
  EnumDescriptor::GetLocationPath(this_01,local_18);
  local_20[1] = 2;
  __x = local_20 + 1;
  std::vector<int,_std::allocator<int>_>::push_back(local_18,__x);
  this_00 = local_18;
  pcVar1 = index(this,(char *)__x,__c);
  local_20[0] = (value_type_conflict)pcVar1;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,local_20);
  return;
}

Assistant:

void EnumValueDescriptor::GetLocationPath(std::vector<int>* output) const {
  type()->GetLocationPath(output);
  output->push_back(EnumDescriptorProto::kValueFieldNumber);
  output->push_back(index());
}